

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_log2_aarch64(float32 a,float_status *status)

{
  uint32_t zSig;
  float32 fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 in_register_0000003c;
  float_status *status_00;
  
  status_00 = (float_status *)CONCAT44(in_register_0000003c,a);
  fVar1 = float32_squash_input_denormal_aarch64(a,status);
  uVar3 = fVar1 & 0x7fffff;
  uVar6 = fVar1 >> 0x17 & 0xff;
  if (uVar6 == 0) {
    if (uVar3 == 0) {
      return 0xff800000;
    }
    uVar6 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
    status_00 = (float_status *)(ulong)uVar6;
    uVar3 = uVar3 << ((char)uVar6 - 8U & 0x1f);
    uVar6 = 9 - uVar6;
  }
  if ((int)fVar1 < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar1 = float32_default_nan_aarch64(status_00);
    return fVar1;
  }
  if (uVar6 != 0xff) {
    uVar3 = uVar3 | 0x800000;
    uVar2 = uVar6 * 0x800000 + 0xc0800000;
    for (uVar7 = 0x400000; uVar7 != 0; uVar7 = uVar7 >> 1) {
      uVar5 = (ulong)uVar3 * (ulong)uVar3;
      uVar4 = (uint)(uVar5 >> 0x17);
      uVar3 = uVar4 >> ((byte)(uint)(uVar5 >> 0x2f) & 1);
      uVar2 = uVar2 | (int)(uVar4 << 7) >> 0x1f & uVar7;
    }
    zSig = -uVar2;
    if (0x7e < (int)uVar6) {
      zSig = uVar2;
    }
    fVar1 = normalizeRoundAndPackFloat32((int)uVar6 < 0x7f,0x85,zSig,status);
    return fVar1;
  }
  if (uVar3 == 0) {
    return fVar1;
  }
  fVar1 = propagateFloat32NaN(fVar1,0,status);
  return fVar1;
}

Assistant:

float32 float32_log2(float32 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint32_t aSig, zSig, i;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat32( 1, 0xFF, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( aExp == 0xFF ) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return a;
    }

    aExp -= 0x7F;
    aSig |= 0x00800000;
    zSign = aExp < 0;
    zSig = aExp << 23;

    for (i = 1 << 22; i > 0; i >>= 1) {
        aSig = ( (uint64_t)aSig * aSig ) >> 23;
        if ( aSig & 0x01000000 ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif

    return normalizeRoundAndPackFloat32(zSign, 0x85, zSig, status);
}